

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenconv.h
# Opt level: O0

vector<float,_std::allocator<float>_> *
makeVectorsFromEigen
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,VectorXf *vecvalues)

{
  float fVar1;
  size_type __n;
  CoeffReturnType pfVar2;
  reference pvVar3;
  ulong local_40;
  size_t i;
  allocator<float> local_22;
  undefined1 local_21;
  size_type local_20;
  size_t n;
  VectorXf *vecvalues_local;
  vector<float,_std::allocator<float>_> *b;
  
  n = (size_t)vecvalues;
  vecvalues_local = (VectorXf *)__return_storage_ptr__;
  __n = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                  ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)vecvalues);
  local_21 = 0;
  local_20 = __n;
  std::allocator<float>::allocator(&local_22);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__n,&local_22);
  std::allocator<float>::~allocator(&local_22);
  for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
    pfVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)n,local_40);
    fVar1 = *pfVar2;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,local_40)
    ;
    *pvVar3 = fVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<float> makeVectorsFromEigen(const VectorXf &vecvalues)
{
    using std::vector;
    size_t n = vecvalues.size();
    vector<float> b(n);
    for (size_t i = 0; i < n; ++i)
    {
        b[i] = vecvalues(i);
    }
    return b;
}